

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor *d)

{
  runner *prVar1;
  undefined8 uVar2;
  bool bVar3;
  const_iterator puVar4;
  undefined8 uVar5;
  size_type sVar6;
  runner **pprVar7;
  long lVar8;
  uchar local_73 [11];
  undefined1 local_68 [8];
  initializer_list<unsigned_char> in;
  error_code ec;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string out;
  IDecompressor *d_local;
  
  out.field_2._8_8_ = d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,5,'\0',&local_31);
  std::allocator<char>::~allocator(&local_31);
  (*(code *)**(undefined8 **)out.field_2._8_8_)();
  system::error_code::error_code((error_code *)&in._M_len);
  uVar2 = out.field_2._8_8_;
  local_73[0] = 0xf2;
  local_73[1] = 0x48;
  local_73[2] = 0xcd;
  local_73[3] = 0xc9;
  local_73[4] = 0xc9;
  local_73[5] = 7;
  local_73[6] = 0;
  local_73[7] = 0;
  local_73[8] = 0;
  local_73[9] = 0xff;
  local_73[10] = 0xff;
  local_68 = (undefined1  [8])local_73;
  in._M_array = (iterator)0xb;
  puVar4 = std::initializer_list<unsigned_char>::begin((initializer_list<unsigned_char> *)local_68);
  (**(code **)(*(long *)uVar2 + 0x28))(uVar2,puVar4);
  uVar2 = out.field_2._8_8_;
  uVar5 = std::__cxx11::string::operator[]((ulong)local_30);
  (**(code **)(*(long *)uVar2 + 0x48))(uVar2,uVar5);
  uVar2 = out.field_2._8_8_;
  sVar6 = std::initializer_list<unsigned_char>::size((initializer_list<unsigned_char> *)local_68);
  (**(code **)(*(long *)uVar2 + 0x18))(uVar2,sVar6);
  uVar2 = out.field_2._8_8_;
  uVar5 = std::__cxx11::string::size();
  (**(code **)(*(long *)uVar2 + 0x38))(uVar2,uVar5);
  in._M_len = (**(code **)(*(long *)out.field_2._8_8_ + 0x50))(out.field_2._8_8_,6);
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  bVar3 = system::error_code::operator_cast_to_bool((error_code *)&in._M_len);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,!bVar3,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x294,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  in._M_len = (**(code **)(*(long *)out.field_2._8_8_ + 0x50))(out.field_2._8_8_,3);
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  bVar3 = system::error_code::operator_cast_to_bool((error_code *)&in._M_len);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,!bVar3,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x296,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  lVar8 = (**(code **)(*(long *)out.field_2._8_8_ + 0x30))();
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,lVar8 == 0,"d.avail_out() == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x297,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello");
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar3,"out == \"Hello\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x298,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static
    void testFixedHuffmanFlushTrees(IDecompressor& d)
    {
        std::string out(5, 0);
        d.init();
        error_code ec;
        std::initializer_list<std::uint8_t> in = {
            0xf2, 0x48, 0xcd, 0xc9, 0xc9, 0x07, 0x00, 0x00,
            0x00, 0xff, 0xff};
        d.next_in(&*in.begin());
        d.next_out(&out[0]);
        d.avail_in(in.size());
        d.avail_out(out.size());
        ec = d.write(Flush::trees);
        BOOST_TEST(!ec);
        ec = d.write(Flush::sync);
        BOOST_TEST(!ec);
        BOOST_TEST(d.avail_out() == 0);
        BOOST_TEST(out == "Hello");
    }